

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::emitShape(SemanticParser *this,SP *shape)

{
  bool bVar1;
  mapped_type *pmVar2;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  SP SVar4;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> _Stack_78;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar1 = std::operator==(&(in_RDX->_M_ptr->super_Node).type,"plymesh");
  if (bVar1) {
    std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,in_RDX);
    emitPlyMesh(this,shape);
    this_00 = &local_38._M_refcount;
  }
  else {
    bVar1 = std::operator==(&(in_RDX->_M_ptr->super_Node).type,"trianglemesh");
    if (bVar1) {
      std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_48,in_RDX);
      emitTriangleMesh(this,shape);
      this_00 = &local_48._M_refcount;
    }
    else {
      bVar1 = std::operator==(&(in_RDX->_M_ptr->super_Node).type,"curve");
      if (bVar1) {
        std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_58,in_RDX);
        emitCurve(this,shape);
        this_00 = &local_58._M_refcount;
      }
      else {
        bVar1 = std::operator==(&(in_RDX->_M_ptr->super_Node).type,"sphere");
        if (bVar1) {
          std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_68,in_RDX);
          emitSphere(this,shape);
          this_00 = &local_68._M_refcount;
        }
        else {
          bVar1 = std::operator==(&(in_RDX->_M_ptr->super_Node).type,"disk");
          if (!bVar1) {
            pmVar2 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                   *)(shape + 0xb),&(in_RDX->_M_ptr->super_Node).type);
            *pmVar2 = *pmVar2 + 1;
            (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            _Var3._M_pi = extraout_RDX_00;
            goto LAB_0014998f;
          }
          std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&_Stack_78,in_RDX);
          emitDisk(this,shape);
          this_00 = &_Stack_78._M_refcount;
        }
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  _Var3._M_pi = extraout_RDX;
LAB_0014998f:
  SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar4.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitShape(pbrt::syntactic::Shape::SP shape)
  {
    if (shape->type == "plymesh") 
      return emitPlyMesh(shape);
    if (shape->type == "trianglemesh")
      return emitTriangleMesh(shape);
    if (shape->type == "curve")
      return emitCurve(shape);
    if (shape->type == "sphere")
      return emitSphere(shape);
    if (shape->type == "disk")
      return emitDisk(shape);

    // throw std::runtime_error("un-handled shape "+shape->type);
    unhandledShapeTypeCounter[shape->type]++;
    // std::cout << "WARNING: un-handled shape " << shape->type << std::endl;
    return Shape::SP();
  }